

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O1

void sect_RelByte(Expression *expr,uint32_t pcShift)

{
  bool bVar1;
  uint8_t uVar2;
  
  bVar1 = checkcodesection();
  if (bVar1) {
    bVar1 = reserveSpace(1);
    if (bVar1) {
      if (expr->isKnown == false) {
        uVar2 = '\0';
        out_CreatePatch(0,expr,loadOffset + curOffset,pcShift);
      }
      else {
        uVar2 = (uint8_t)expr->val;
      }
      currentSection->data[loadOffset + curOffset] = uVar2;
      growSection(1);
      rpn_Free(expr);
      return;
    }
  }
  return;
}

Assistant:

void sect_RelByte(struct Expression *expr, uint32_t pcShift)
{
	if (!checkcodesection())
		return;
	if (!reserveSpace(1))
		return;

	if (!rpn_isKnown(expr)) {
		createPatch(PATCHTYPE_BYTE, expr, pcShift);
		writebyte(0);
	} else {
		writebyte(expr->val);
	}
	rpn_Free(expr);
}